

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall TApp_FallThroughEquals_Test::TestBody(TApp_FallThroughEquals_Test *this)

{
  App *this_00;
  long lVar1;
  allocator local_d6;
  allocator local_d5;
  int val;
  allocator local_d0 [32];
  string local_b0 [32];
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  (this->super_TApp).app.fallthrough_ = true;
  val = 1;
  std::__cxx11::string::string((string *)&local_30,"--val",local_d0);
  std::__cxx11::string::string((string *)&local_50,"",&local_d6);
  this_00 = &(this->super_TApp).app;
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_30,&val,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_70,"sub",local_d0);
  std::__cxx11::string::string((string *)&local_90,"",&local_d6);
  CLI::App::add_subcommand(this_00,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)local_d0,"sub",&local_d6);
  std::__cxx11::string::string(local_b0,"--val=2",&local_d5);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_d0,&local_90);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_d0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, FallThroughEquals) {
    app.fallthrough();
    int val = 1;
    app.add_option("--val", val);

    app.add_subcommand("sub");

    args = {"sub", "--val=2"};
    // Should not throw
    run();
}